

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libauthretry.c
# Opt level: O3

CURLcode send_request(CURL *curl,char *url,int seq,long auth_scheme,char *userpwd)

{
  CURLcode CVar1;
  size_t sVar2;
  void *__ptr;
  
  sVar2 = strlen(url);
  __ptr = malloc(sVar2 + 5);
  if (__ptr == (void *)0x0) {
    curl_mfprintf(_stderr,"Not enough memory for full url\n");
    CVar1 = CURLE_OUT_OF_MEMORY;
  }
  else {
    curl_msnprintf(__ptr,sVar2 + 5,"%s%04d",url,seq);
    curl_mfprintf(_stderr,"Sending new request %d to %s with credential %s (auth %ld)\n",seq,__ptr,
                  userpwd,auth_scheme);
    CVar1 = curl_easy_setopt(curl,0x2712,__ptr);
    if (CVar1 == CURLE_OK) {
      CVar1 = curl_easy_setopt(curl,0x29,1);
      if (CVar1 == CURLE_OK) {
        CVar1 = curl_easy_setopt(curl,0x2a,1);
        if (CVar1 == CURLE_OK) {
          CVar1 = curl_easy_setopt(curl,0x50,1);
          if (CVar1 == CURLE_OK) {
            CVar1 = curl_easy_setopt(curl,0x2715,userpwd);
            if (CVar1 == CURLE_OK) {
              CVar1 = curl_easy_setopt(curl,0x6b,auth_scheme);
              if (CVar1 == CURLE_OK) {
                CVar1 = curl_easy_perform(curl);
              }
            }
          }
        }
      }
    }
    free(__ptr);
  }
  return CVar1;
}

Assistant:

static CURLcode send_request(CURL *curl, const char *url, int seq,
                             long auth_scheme, const char *userpwd)
{
  CURLcode res;
  size_t len = strlen(url) + 4 + 1;
  char *full_url = malloc(len);
  if(!full_url) {
    fprintf(stderr, "Not enough memory for full url\n");
    return CURLE_OUT_OF_MEMORY;
  }

  snprintf(full_url, len, "%s%04d", url, seq);
  fprintf(stderr, "Sending new request %d to %s with credential %s "
          "(auth %ld)\n", seq, full_url, userpwd, auth_scheme);
  test_setopt(curl, CURLOPT_URL, full_url);
  test_setopt(curl, CURLOPT_VERBOSE, 1L);
  test_setopt(curl, CURLOPT_HEADER, 1L);
  test_setopt(curl, CURLOPT_HTTPGET, 1L);
  test_setopt(curl, CURLOPT_USERPWD, userpwd);
  test_setopt(curl, CURLOPT_HTTPAUTH, auth_scheme);

  res = curl_easy_perform(curl);

test_cleanup:
  free(full_url);
  return res;
}